

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppp.cpp
# Opt level: O2

void __thiscall pg::PPPSolver::run(PPPSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  bitset *pbVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  ostream *poVar14;
  int i;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint i_00;
  uint uVar20;
  ulong uVar21;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar17 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  uVar21 = (ulong)(iVar17 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar21;
  uVar9 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar18 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar18 = 0xffffffffffffffff;
  }
  (this->super_PPSolver).max_prio = iVar17;
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar18);
  *puVar10 = uVar21;
  if (iVar17 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) - (uVar9 - 0x18) % 0x18) + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar18 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar11 = (int *)operator_new__(uVar18);
  (this->super_PPSolver).region = piVar11;
  piVar12 = (int *)operator_new__(uVar18);
  (this->super_PPSolver).strategy = piVar12;
  uVar18 = uVar21 << 2;
  if (iVar17 < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar18);
  (this->super_PPSolver).inverse = piVar13;
  pbVar3 = (this->super_PPSolver).super_Solver.disabled;
  uVar18 = ~((long)uVar16 >> 0x3f) & uVar16;
  for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    iVar17 = -2;
    if ((pbVar3->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
      iVar17 = piVar2[uVar9];
    }
    piVar11[uVar9] = iVar17;
  }
  for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    piVar12[uVar9] = -1;
  }
  this->reset0 = -1;
  this->reset1 = -1;
  (this->super_PPSolver).promotions = 0;
  i_00 = (int)uVar16 - 1;
LAB_0014a5c9:
  do {
    if ((int)i_00 < 0) {
LAB_0014a7cc:
      pvVar4 = (this->super_PPSolver).regions;
      if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (piVar5 != (pointer)0x0) {
          lVar19 = (long)piVar5 * 0x18;
          do {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)
                       ((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar19));
            lVar19 = lVar19 + -0x18;
          } while (lVar19 != 0);
        }
        operator_delete__(&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar5 * 0x18 + 8);
      }
      piVar2 = (this->super_PPSolver).region;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      piVar2 = (this->super_PPSolver).strategy;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      piVar2 = (this->super_PPSolver).inverse;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
      }
      poVar14 = std::operator<<((this->super_PPSolver).super_Solver.logger,"solved with ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,(this->super_PPSolver).promotions);
      poVar14 = std::operator<<(poVar14," promotions.");
      std::endl<char,std::char_traits<char>>(poVar14);
      return;
    }
    piVar2 = ((this->super_PPSolver).super_Solver.game)->_priority;
    uVar20 = piVar2[i_00];
    while( true ) {
      if ((int)i_00 < 0) goto LAB_0014a7cc;
      uVar16 = (ulong)i_00;
      if (piVar2[uVar16] != uVar20) {
        pvVar4 = (this->super_PPSolver).regions;
        if (pvVar4[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar4[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          PPSolver::resetRegion(&this->super_PPSolver,uVar20);
          if ((uVar20 & 1) == 0) {
            this->reset0 = uVar20 - 2;
          }
          else {
            this->reset1 = uVar20 - 2;
          }
        }
        goto LAB_0014a5c9;
      }
      if (((((this->super_PPSolver).super_Solver.disabled)->_bits[i_00 >> 6] >> (uVar16 & 0x3f) & 1)
           == 0) && ((this->super_PPSolver).region[uVar16] <= (int)uVar20)) break;
      i_00 = i_00 - 1;
    }
    (this->super_PPSolver).inverse[(int)uVar20] = i_00;
    if ((uVar20 & 1) == 0) {
      if (this->reset0 < (int)uVar20) goto LAB_0014a68a;
      this->reset0 = uVar20 - 2;
LAB_0014a698:
      bVar7 = true;
    }
    else {
      if ((int)uVar20 <= this->reset1) {
        this->reset1 = uVar20 - 2;
        goto LAB_0014a698;
      }
LAB_0014a68a:
      bVar7 = false;
    }
    bVar7 = PPSolver::setupRegion(&this->super_PPSolver,i_00,uVar20,bVar7);
    if (bVar7) {
      while( true ) {
        uVar16 = (ulong)i_00;
        if (1 < (this->super_PPSolver).super_Solver.trace) {
          PPSolver::reportRegion(&this->super_PPSolver,uVar20);
        }
        uVar8 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,uVar16,(ulong)uVar20);
        if (uVar8 == 0xffffffff) {
          PPSolver::setDominion(&this->super_PPSolver,uVar20);
          pGVar1 = (this->super_PPSolver).super_Solver.game;
          i_00 = (int)pGVar1->n_vertices - 1;
          uVar20 = pGVar1->_priority[(int)i_00];
          this->reset0 = uVar20;
          this->reset1 = uVar20;
          if ((uVar20 & 1) == 0) {
            this->reset1 = uVar20 - 1;
          }
          else {
            this->reset0 = uVar20 - 1;
          }
          goto LAB_0014a5c9;
        }
        if (uVar8 == 0xfffffffe) break;
        PPSolver::promote(&this->super_PPSolver,uVar20,uVar8);
        if ((uVar8 & 1) == 0) {
          if (this->reset1 < (int)uVar8) {
            this->reset1 = uVar8 - 1;
          }
        }
        else if (this->reset0 < (int)uVar8) {
          this->reset0 = uVar8 - 1;
        }
        i_00 = (this->super_PPSolver).inverse[(int)uVar8];
        uVar20 = uVar8;
      }
      uVar8 = 0xffffffff;
      if ((int)i_00 < -1) {
        uVar8 = i_00;
      }
      while ((uVar15 = (uint)uVar16, i_00 = uVar8, -1 < (int)uVar15 &&
             (i_00 = uVar15,
             (int)uVar20 <= ((this->super_PPSolver).super_Solver.game)->_priority[uVar16]))) {
        uVar16 = (ulong)(uVar15 - 1);
      }
    }
    else {
      for (uVar8 = i_00;
          (i_00 = 0xffffffff, -1 < (int)uVar8 &&
          (i_00 = uVar8, ((this->super_PPSolver).super_Solver.game)->_priority[uVar8] == uVar20));
          uVar8 = uVar8 - 1) {
      }
    }
  } while( true );
}

Assistant:

void
PPPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize reset values
    reset0 = -1;
    reset1 = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) {
                resetRegion(p);
                // but then we must also reset everything lower...
                if (p&1) reset1 = p-2;
                else reset0 = p-2;
            }
            continue;
        }

        inverse[p] = i;

        // PPP: reset if lower than value
        bool reset = false;
        if (p&1) {
            if (p <= reset1) {
                reset = true;
                reset1 = p-2;
            }
        } else {
            if (p <= reset0) {
                reset = true;
                reset0 = p-2;
            }
        }
        if (setupRegion(i, p, reset)) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) >= p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    reset0 = priority(nodecount()-1);
                    reset1 = priority(nodecount()-1);
                    if (reset0&1) reset0--;
                    else reset1--;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // increase reset value if needed
                    if (res&1) {
                        if (res > reset0) reset0 = res-1;
                    } else {
                        if (res > reset1) reset1 = res-1;
                    }
                    // continue inner loop with higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}